

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::preprocessingInitital(CScanner *this,char c)

{
  char c_local;
  CScanner *this_local;
  
  if (c == '\'') {
    processing(this,'\0');
    setLineAndPositionOfToken(this);
    std::__cxx11::string::clear();
    this->preprocessingState = PS_String;
  }
  else if (c == '*') {
    processing(this,'\0');
    this->savedPreprocessingState = PS_Initial;
    this->preprocessingState = PS_SingleLineComment;
  }
  else if (c == '+') {
    processing(this,'\0');
    this->preprocessingState = PS_Plus;
  }
  else if (c == ';') {
    warning(this,W_Semicolon,';');
    processing(this,'\n');
  }
  else if (c == '{') {
    processing(this,'\0');
    this->savedPreprocessingState = PS_Initial;
    this->preprocessingState = PS_MultilineComment;
  }
  else {
    processing(this,c);
  }
  return;
}

Assistant:

void CScanner::preprocessingInitital( char c )
{
	switch( c ) {
		case Quote:
			processing( UniversalSeparatorOfTokens );
			setLineAndPositionOfToken();
			token.word.clear();
			preprocessingState = PS_String;
			break;
		case Plus:
			processing( UniversalSeparatorOfTokens );
			preprocessingState = PS_Plus;
			break;
		case SingleLineCommentBegin:
			processing( UniversalSeparatorOfTokens );
			savedPreprocessingState = PS_Initial;
			preprocessingState = PS_SingleLineComment;
			break;
		case MultilineCommentBegin:
			processing( UniversalSeparatorOfTokens );
			savedPreprocessingState = PS_Initial;
			preprocessingState = PS_MultilineComment;
			break;
		case Semicolon:
			warning( W_Semicolon, c );
			processing( LineFeed );
			break;
		default:
			processing( c );
			break;
	}
}